

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix3f.cpp
# Opt level: O2

Matrix3f * __thiscall
Matrix3f::inverse(Matrix3f *__return_storage_ptr__,Matrix3f *this,bool *pbIsSingular,float epsilon)

{
  float m00;
  float m00_00;
  float m01;
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  
  fVar10 = this->m_elements[0];
  fVar9 = this->m_elements[1];
  fVar6 = this->m_elements[2];
  m00 = this->m_elements[3];
  m00_00 = this->m_elements[4];
  fVar7 = this->m_elements[5];
  m01 = this->m_elements[6];
  fVar8 = this->m_elements[7];
  fVar5 = this->m_elements[8];
  fVar1 = Matrix2f::determinant2x2(m00_00,fVar8,fVar7,fVar5);
  fVar2 = Matrix2f::determinant2x2(fVar9,fVar8,fVar6,fVar5);
  fVar3 = Matrix2f::determinant2x2(fVar9,m00_00,fVar6,fVar7);
  fVar4 = Matrix2f::determinant2x2(m00,m01,fVar7,fVar5);
  fVar5 = Matrix2f::determinant2x2(fVar10,m01,fVar6,fVar5);
  fVar6 = Matrix2f::determinant2x2(fVar10,m00,fVar6,fVar7);
  fVar7 = Matrix2f::determinant2x2(m00,m01,m00_00,fVar8);
  fVar8 = Matrix2f::determinant2x2(fVar10,m01,fVar9,fVar8);
  fVar9 = Matrix2f::determinant2x2(fVar10,m00,fVar9,m00_00);
  fVar10 = m01 * fVar3 + (fVar10 * fVar1 - m00 * fVar2);
  if (epsilon <= ABS(fVar10)) {
    if (pbIsSingular != (bool *)0x0) {
      *pbIsSingular = false;
    }
    fVar10 = 1.0 / fVar10;
    __return_storage_ptr__->m_elements[0] = fVar1 * fVar10;
    __return_storage_ptr__->m_elements[1] = -fVar2 * fVar10;
    __return_storage_ptr__->m_elements[2] = fVar3 * fVar10;
    __return_storage_ptr__->m_elements[3] = -fVar4 * fVar10;
    __return_storage_ptr__->m_elements[4] = fVar5 * fVar10;
    __return_storage_ptr__->m_elements[5] = -fVar6 * fVar10;
    __return_storage_ptr__->m_elements[6] = fVar7 * fVar10;
    __return_storage_ptr__->m_elements[7] = -fVar8 * fVar10;
    __return_storage_ptr__->m_elements[8] = fVar9 * fVar10;
  }
  else {
    if (pbIsSingular != (bool *)0x0) {
      *pbIsSingular = true;
    }
    Matrix3f(__return_storage_ptr__,0.0);
  }
  return __return_storage_ptr__;
}

Assistant:

Matrix3f Matrix3f::inverse( bool* pbIsSingular, float epsilon ) const
{
	float m00 = m_elements[ 0 ];
	float m10 = m_elements[ 1 ];
	float m20 = m_elements[ 2 ];

	float m01 = m_elements[ 3 ];
	float m11 = m_elements[ 4 ];
	float m21 = m_elements[ 5 ];

	float m02 = m_elements[ 6 ];
	float m12 = m_elements[ 7 ];
	float m22 = m_elements[ 8 ];

	float cofactor00 =  Matrix2f::determinant2x2( m11, m12, m21, m22 );
	float cofactor01 = -Matrix2f::determinant2x2( m10, m12, m20, m22 );
	float cofactor02 =  Matrix2f::determinant2x2( m10, m11, m20, m21 );

	float cofactor10 = -Matrix2f::determinant2x2( m01, m02, m21, m22 );
	float cofactor11 =  Matrix2f::determinant2x2( m00, m02, m20, m22 );
	float cofactor12 = -Matrix2f::determinant2x2( m00, m01, m20, m21 );

	float cofactor20 =  Matrix2f::determinant2x2( m01, m02, m11, m12 );
	float cofactor21 = -Matrix2f::determinant2x2( m00, m02, m10, m12 );
	float cofactor22 =  Matrix2f::determinant2x2( m00, m01, m10, m11 );

	float determinant = m00 * cofactor00 + m01 * cofactor01 + m02 * cofactor02;
	
	bool isSingular = ( fabs( determinant ) < epsilon );
	if( isSingular )
	{
		if( pbIsSingular != NULL )
		{
			*pbIsSingular = true;
		}
		return Matrix3f();
	}
	else
	{
		if( pbIsSingular != NULL )
		{
			*pbIsSingular = false;
		}

		float reciprocalDeterminant = 1.0f / determinant;

		return Matrix3f
		(
			cofactor00 * reciprocalDeterminant, cofactor10 * reciprocalDeterminant, cofactor20 * reciprocalDeterminant,
			cofactor01 * reciprocalDeterminant, cofactor11 * reciprocalDeterminant, cofactor21 * reciprocalDeterminant,
			cofactor02 * reciprocalDeterminant, cofactor12 * reciprocalDeterminant, cofactor22 * reciprocalDeterminant
		);
	}
}